

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O3

bool google::protobuf::compiler::cxx::anon_unknown_0::HasRequiredFields
               (Descriptor *type,
               hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
               *already_seen)

{
  long lVar1;
  Descriptor **ppDVar2;
  bool bVar3;
  long lVar4;
  Descriptor *pDVar5;
  _Node *p_Var6;
  long lVar7;
  Descriptor *local_48;
  undefined1 local_40 [24];
  
  p_Var6 = (already_seen->
           super_unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ).
           super___unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>,_false>
           .
           super__Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
           ._M_buckets
           [(ulong)type %
            (already_seen->
            super_unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ).
            super___unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>,_false>
            .
            super__Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
            ._M_bucket_count];
  if (p_Var6 != (_Node *)0x0) {
    lVar4 = 0;
    do {
      ppDVar2 = &p_Var6->_M_v;
      p_Var6 = p_Var6->_M_next;
      lVar4 = lVar4 + (ulong)(*ppDVar2 == type);
    } while (p_Var6 != (_Hash_node<const_google::protobuf::Descriptor_*,_false> *)0x0);
    if (lVar4 != 0) {
      return false;
    }
  }
  local_48 = type;
  std::tr1::
  _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
  ::_M_insert(local_40,(_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                        *)already_seen,&local_48);
  if (0 < *(int *)(local_48 + 0x58)) {
    return true;
  }
  if (0 < *(int *)(local_48 + 0x2c)) {
    lVar4 = 0x2c;
    lVar7 = 0;
    pDVar5 = local_48;
    do {
      lVar1 = *(long *)(pDVar5 + 0x30);
      if (*(int *)(lVar1 + 4 + lVar4) == 2) {
        return true;
      }
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar1 + lVar4) * 4) == 10)
         && (bVar3 = HasRequiredFields(*(Descriptor **)(lVar1 + 0x1c + lVar4),already_seen),
            pDVar5 = local_48, bVar3)) {
        return true;
      }
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0x78;
    } while (lVar7 < *(int *)(pDVar5 + 0x2c));
  }
  return false;
}

Assistant:

static bool HasRequiredFields(
    const Descriptor* type,
    hash_set<const Descriptor*>* already_seen) {
  if (already_seen->count(type) > 0) {
    // Since the first occurrence of a required field causes the whole
    // function to return true, we can assume that if the type is already
    // in the cache it didn't have any required fields.
    return false;
  }
  already_seen->insert(type);

  // If the type has extensions, an extension with message type could contain
  // required fields, so we have to be conservative and assume such an
  // extension exists.
  if (type->extension_range_count() > 0) return true;

  for (int i = 0; i < type->field_count(); i++) {
    const FieldDescriptor* field = type->field(i);
    if (field->is_required()) {
      return true;
    }
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !ShouldIgnoreRequiredFieldCheck(field)) {
      if (HasRequiredFields(field->message_type(), already_seen)) {
        return true;
      }
    }
  }

  return false;
}